

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
* __thiscall
soul::StructuralParser::parseGenericFunctionWildcardList
          (vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
           *__return_storage_ptr__,StructuralParser *this)

{
  bool bVar1;
  pool_ref<soul::AST::UnqualifiedName> local_80;
  UnqualifiedName *local_78;
  UnqualifiedName *wildcard;
  CompileMessage local_60;
  char *local_28;
  undefined1 local_19;
  StructuralParser *local_18;
  StructuralParser *this_local;
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  *wildcards;
  
  local_19 = 0;
  local_18 = this;
  this_local = (StructuralParser *)__return_storage_ptr__;
  std::
  vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    local_28 = "$identifier";
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matches(&this->super_SOULTokeniser,(TokenType)"$identifier");
    if (!bVar1) {
      Errors::expectedGenericWildcardName<>();
      (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
    local_78 = parseUnqualifiedName(this);
    pool_ref<soul::AST::UnqualifiedName>::pool_ref<soul::AST::UnqualifiedName,void>
              (&local_80,local_78);
    std::
    vector<soul::pool_ref<soul::AST::UnqualifiedName>,_std::allocator<soul::pool_ref<soul::AST::UnqualifiedName>_>_>
    ::push_back(__return_storage_ptr__,&local_80);
    pool_ref<soul::AST::UnqualifiedName>::~pool_ref(&local_80);
    bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x574319);
    if (bVar1) break;
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)",");
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<AST::UnqualifiedName>> parseGenericFunctionWildcardList()
    {
        std::vector<pool_ref<AST::UnqualifiedName>> wildcards;

        for (;;)
        {
            if (! matches (Token::identifier))
                throwError (Errors::expectedGenericWildcardName());

            auto& wildcard = parseUnqualifiedName();

            wildcards.push_back (wildcard);

            if (matchIf (Operator::greaterThan))
                break;

            expect (Operator::comma);
        }

        return wildcards;
    }